

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall kj::(anonymous_namespace)::InMemoryFile::~InMemoryFile(InMemoryFile *this)

{
  long lVar1;
  undefined8 uVar2;
  
  lVar1 = *(long *)(this + 0x30);
  if (lVar1 != 0) {
    uVar2 = *(undefined8 *)(this + 0x38);
    *(undefined8 *)(this + 0x30) = 0;
    *(undefined8 *)(this + 0x38) = 0;
    (**(code **)**(undefined8 **)(this + 0x40))(*(undefined8 **)(this + 0x40),lVar1,1,uVar2,uVar2,0)
    ;
  }
  kj::_::Mutex::~Mutex((Mutex *)(this + 0x10));
  AtomicRefcounted::~AtomicRefcounted((AtomicRefcounted *)this);
  operator_delete(this + -8,0x68);
  return;
}

Assistant:

InMemoryFile(const Clock& clock): impl(clock) {}